

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void lj_trace_freestate(global_State *g)

{
  long lVar1;
  long in_RDI;
  jit_State *J;
  jit_State *in_stack_ffffffffffffffa0;
  
  lj_mcode_free(in_stack_ffffffffffffffa0);
  lVar1 = (ulong)*(uint *)(in_RDI + 0x3a8) * 4;
  *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) - (int)lVar1;
  *(long *)(in_RDI + 0x90) = lVar1 + *(long *)(in_RDI + 0x90);
  (**(code **)(in_RDI + 0x40))
            (*(undefined8 *)(in_RDI + 0x48),*(undefined8 *)(in_RDI + 0x3a0),lVar1,0);
  lVar1 = (ulong)*(uint *)(in_RDI + 0x394) * 0xc;
  *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) - (int)lVar1;
  *(long *)(in_RDI + 0x90) = lVar1 + *(long *)(in_RDI + 0x90);
  (**(code **)(in_RDI + 0x40))
            (*(undefined8 *)(in_RDI + 0x48),*(undefined8 *)(in_RDI + 0x398),lVar1,0);
  lVar1 = (ulong)(uint)(*(int *)(in_RDI + 0x388) - *(int *)(in_RDI + 0x38c)) * 8;
  *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) - (int)lVar1;
  *(long *)(in_RDI + 0x90) = lVar1 + *(long *)(in_RDI + 0x90);
  (**(code **)(in_RDI + 0x40))
            (*(undefined8 *)(in_RDI + 0x48),
             *(long *)(in_RDI + 0x380) + (ulong)*(uint *)(in_RDI + 0x38c) * 8,lVar1,0);
  lVar1 = (ulong)*(uint *)(in_RDI + 0x3c4) * 4;
  *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) - (int)lVar1;
  *(long *)(in_RDI + 0x90) = lVar1 + *(long *)(in_RDI + 0x90);
  (**(code **)(in_RDI + 0x40))
            (*(undefined8 *)(in_RDI + 0x48),*(undefined8 *)(in_RDI + 0x3b8),lVar1,0);
  return;
}

Assistant:

void lj_trace_freestate(global_State *g)
{
  jit_State *J = G2J(g);
#ifdef LUA_USE_ASSERT
  {  /* This assumes all traces have already been freed. */
    ptrdiff_t i;
    for (i = 1; i < (ptrdiff_t)J->sizetrace; i++)
      lj_assertG(i == (ptrdiff_t)J->cur.traceno || traceref(J, i) == NULL,
		 "trace still allocated");
  }
#endif
  lj_mcode_free(J);
  lj_mem_freevec(g, J->snapmapbuf, J->sizesnapmap, SnapEntry);
  lj_mem_freevec(g, J->snapbuf, J->sizesnap, SnapShot);
  lj_mem_freevec(g, J->irbuf + J->irbotlim, J->irtoplim - J->irbotlim, IRIns);
  lj_mem_freevec(g, J->trace, J->sizetrace, GCRef);
}